

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.cpp
# Opt level: O0

int mbedtls_aes_setkey_dec(mbedtls_aes_context *ctx,uchar *key,uint keybits)

{
  uint uVar1;
  int iVar2;
  int *piVar3;
  int *piVar4;
  int *in_RDI;
  int j;
  int i;
  uint32_t *RK;
  mbedtls_aes_context cty;
  int ret;
  uint32_t *SK;
  int local_158;
  int local_154;
  uint *local_150;
  uint local_148 [3];
  uint in_stack_fffffffffffffec4;
  uchar *in_stack_fffffffffffffec8;
  mbedtls_aes_context *in_stack_fffffffffffffed0;
  uint *local_20;
  
  mbedtls_aes_init((mbedtls_aes_context *)0x8678e8);
  uVar1 = mbedtls_aes_rk_offset((uint32_t *)(in_RDI + 4));
  *(ulong *)(in_RDI + 2) = (ulong)uVar1;
  piVar3 = in_RDI + *(long *)(in_RDI + 2) + 4;
  iVar2 = mbedtls_aes_setkey_enc
                    (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec4);
  if (iVar2 == 0) {
    *in_RDI = local_148[0];
    piVar4 = (int *)(&stack0xfffffffffffffec8 +
                    (long)(int)(local_148[0] << 2) * 4 +
                    CONCAT44(in_stack_fffffffffffffec4,local_148[2]) * 4);
    *piVar3 = *piVar4;
    piVar3[1] = piVar4[1];
    piVar3[2] = piVar4[2];
    local_150 = (uint *)(piVar3 + 4);
    piVar3[3] = piVar4[3];
    local_20 = (uint *)(piVar4 + -4);
    local_154 = *in_RDI;
    while (local_154 = local_154 + -1, 0 < local_154) {
      for (local_158 = 0; local_158 < 4; local_158 = local_158 + 1) {
        *local_150 = RT0[FSb[*local_20 & 0xff]] ^ RT1[FSb[*local_20 >> 8 & 0xff]] ^
                     RT2[FSb[*local_20 >> 0x10 & 0xff]] ^ RT3[FSb[*local_20 >> 0x18]];
        local_20 = local_20 + 1;
        local_150 = local_150 + 1;
      }
      local_20 = local_20 + -8;
    }
    *local_150 = *local_20;
    local_150[1] = local_20[1];
    local_150[2] = local_20[2];
    local_150[3] = local_20[3];
  }
  mbedtls_aes_free((mbedtls_aes_context *)0x867c4e);
  return iVar2;
}

Assistant:

int mbedtls_aes_setkey_dec(mbedtls_aes_context *ctx, const unsigned char *key,
                           unsigned int keybits)
{
#if !defined(MBEDTLS_AES_USE_HARDWARE_ONLY)
    uint32_t *SK;
#endif
    int ret;
    mbedtls_aes_context cty;
    uint32_t *RK;


    mbedtls_aes_init(&cty);

    ctx->rk_offset = mbedtls_aes_rk_offset(ctx->buf);
    RK = ctx->buf + ctx->rk_offset;

    /* Also checks keybits */
    if ((ret = mbedtls_aes_setkey_enc(&cty, key, keybits)) != 0) {
        goto exit;
    }

    ctx->nr = cty.nr;

#if defined(MBEDTLS_AESNI_HAVE_CODE)
    if (mbedtls_aesni_has_support(MBEDTLS_AESNI_AES)) {
        mbedtls_aesni_inverse_key((unsigned char *) RK,
                                  (const unsigned char *) (cty.buf + cty.rk_offset), ctx->nr);
        goto exit;
    }
#endif

#if defined(MBEDTLS_AESCE_HAVE_CODE)
    if (MBEDTLS_AESCE_HAS_SUPPORT()) {
        mbedtls_aesce_inverse_key(
            (unsigned char *) RK,
            (const unsigned char *) (cty.buf + cty.rk_offset),
            ctx->nr);
        goto exit;
    }
#endif

#if !defined(MBEDTLS_AES_USE_HARDWARE_ONLY)
    SK = cty.buf + cty.rk_offset + cty.nr * 4;

    *RK++ = *SK++;
    *RK++ = *SK++;
    *RK++ = *SK++;
    *RK++ = *SK++;
    SK -= 8;
    for (int i = ctx->nr - 1; i > 0; i--, SK -= 8) {
        for (int j = 0; j < 4; j++, SK++) {
            *RK++ = AES_RT0(FSb[MBEDTLS_BYTE_0(*SK)]) ^
                    AES_RT1(FSb[MBEDTLS_BYTE_1(*SK)]) ^
                    AES_RT2(FSb[MBEDTLS_BYTE_2(*SK)]) ^
                    AES_RT3(FSb[MBEDTLS_BYTE_3(*SK)]);
        }
    }

    *RK++ = *SK++;
    *RK++ = *SK++;
    *RK++ = *SK++;
    *RK++ = *SK++;
#endif /* !MBEDTLS_AES_USE_HARDWARE_ONLY */
exit:
    mbedtls_aes_free(&cty);

    return ret;
}